

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,int type)

{
  int iVar1;
  xmlHashTablePtr hash;
  
  hash = ctxt->attsSpecial;
  if (hash == (xmlHashTablePtr)0x0) {
    hash = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsSpecial = hash;
    if (hash == (xmlHashTablePtr)0x0) goto LAB_001396eb;
  }
  iVar1 = xmlHashAdd2(hash,fullname,fullattr,(void *)(ulong)(uint)type);
  if (-1 < iVar1) {
    return;
  }
LAB_001396eb:
  xmlCtxtErrMemory(ctxt);
  return;
}

Assistant:

static void
xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,
		  const xmlChar *fullname,
		  const xmlChar *fullattr,
		  int type)
{
    if (ctxt->attsSpecial == NULL) {
        ctxt->attsSpecial = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsSpecial == NULL)
	    goto mem_error;
    }

    if (xmlHashAdd2(ctxt->attsSpecial, fullname, fullattr,
                    XML_INT_TO_PTR(type)) < 0)
        goto mem_error;
    return;

mem_error:
    xmlErrMemory(ctxt);
}